

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

char16_t *
kj::_::CopyConstructArray_<char16_t,_char16_t_*,_true,_false>::apply
          (char16_t *pos,char16_t *start,char16_t *end)

{
  char16_t *params;
  char16_t *end_local;
  char16_t *start_local;
  char16_t *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<char16_t>(end_local);
    ctor<char16_t,char16_t>(start_local,params);
    end_local = end_local + 1;
    start_local = start_local + 1;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }